

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-barrier.c
# Opt level: O3

void serial_worker(void *data)

{
  int iVar1;
  
  iVar1 = 5;
  do {
    uv_barrier_wait((uv_barrier_t *)data);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  iVar1 = uv_barrier_wait((uv_barrier_t *)data);
  if (0 < iVar1) {
    uv_barrier_destroy((uv_barrier_t *)data);
  }
  uv_sleep(100);
  return;
}

Assistant:

static void serial_worker(void* data) {
  uv_barrier_t* barrier;
  unsigned i;

  barrier = data;
  for (i = 0; i < 5; i++)
    uv_barrier_wait(barrier);
  if (uv_barrier_wait(barrier) > 0)
    uv_barrier_destroy(barrier);

  uv_sleep(100);  /* Wait a bit before terminating. */
}